

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondH10BeatsFirst.h
# Opt level: O1

int __thiscall
SecondH10BeatsFirst::getHighestCardID
          (SecondH10BeatsFirst *this,int previous,vector<Card,_std::allocator<Card>_> *cards)

{
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> _Var1;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_equals_val<Card_const>>
                    ((cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current !=
      (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_equals_val<Card_const>>
                      (_Var1._M_current + 1);
    if (_Var1._M_current !=
        (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      previous = (int)((ulong)((long)_Var1._M_current -
                              (long)(cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl
                                    .super__Vector_impl_data._M_start) >> 3);
    }
  }
  return previous;
}

Assistant:

int getHighestCardID(int previous, const std::vector<Card> &cards) override{
        auto first = std::find(cards.begin(), cards.end(), Card(Suit::HEARTS, CardValue::TEN));
        if(first != cards.end()){
           auto second = std::find(first + 1, cards.end(), Card(Suit::HEARTS, CardValue::TEN));
           if(second != cards.end()) {
               return (int) std::distance(cards.begin(), second);
           }
        }
        return previous;
    }